

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

string * __thiscall
duckdb::StrpTimeFormat::ParseResult::FormatError
          (string *__return_storage_ptr__,ParseResult *this,string_t input,string *format_specifier)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined8 local_100;
  long local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_f8 = input.value._8_8_;
  local_100 = input.value._0_8_;
  local_f0[0] = local_e0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,
             "Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s","")
  ;
  lVar2 = (long)&local_100 + 4;
  if (0xc < (local_100 & 0xffffffff)) {
    lVar2 = local_f8;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,lVar2,(local_100 & 0xffffffff) + lVar2);
  pcVar1 = (format_specifier->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + format_specifier->_M_string_length);
  lVar2 = (long)&local_100 + 4;
  if (0xc < (local_100 & 0xffffffff)) {
    lVar2 = local_f8;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,lVar2,(local_100 & 0xffffffff) + lVar2);
  FormatStrpTimeError(&local_50,&local_b0,(optional_idx)(this->error_position).index);
  pcVar1 = (this->error_message)._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + (this->error_message)._M_string_length);
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_f0,&local_70,&local_90,&local_50,&local_d0,
             in_stack_fffffffffffffef8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrpTimeFormat::ParseResult::FormatError(string_t input, const string &format_specifier) {
	return StringUtil::Format("Could not parse string \"%s\" according to format specifier \"%s\"\n%s\nError: %s",
	                          input.GetString(), format_specifier,
	                          FormatStrpTimeError(input.GetString(), error_position), error_message);
}